

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O3

QList<int> * __thiscall
QDockAreaLayoutInfo::gapIndex
          (QList<int> *__return_storage_ptr__,QDockAreaLayoutInfo *this,QPoint *_pos,
          bool nestingEnabled,TabMode tabMode)

{
  Orientation OVar1;
  QDockAreaLayoutItem *pQVar2;
  QDockAreaLayoutInfo *this_00;
  int *piVar3;
  bool bVar4;
  char cVar5;
  QPoint *pQVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  qsizetype i;
  int iVar10;
  int iVar11;
  long lVar12;
  uint uVar13;
  uint index;
  ulong uVar14;
  long in_FS_OFFSET;
  QRect QVar15;
  undefined1 local_58 [8];
  int local_50;
  int local_4c;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (int *)0x0;
  (__return_storage_ptr__->d).size = 0;
  if (this->tabbed != true) {
    pQVar6 = (QPoint *)&_pos->yp;
    if (this->o == Horizontal) {
      pQVar6 = _pos;
    }
    if ((this->item_list).d.size == 0) {
      QVar15 = (QRect)(ZEXT816(0xffffffffffffffff) << 0x40);
      index = 0xffffffff;
      uVar13 = 0;
    }
    else {
      iVar7 = (pQVar6->xp).m_i;
      uVar8 = 0xffffffff;
      lVar12 = 0;
      uVar14 = 0;
      do {
        pQVar2 = (this->item_list).d.ptr;
        bVar4 = QDockAreaLayoutItem::skip
                          ((QDockAreaLayoutItem *)((long)&pQVar2->widgetItem + lVar12));
        if (!bVar4) {
          index = (uint)uVar14;
          if (iVar7 <= *(int *)((long)&pQVar2->size + lVar12) +
                       *(int *)((long)&pQVar2->pos + lVar12)) {
            this_00 = *(QDockAreaLayoutInfo **)((long)&pQVar2->subinfo + lVar12);
            if ((this_00 == (QDockAreaLayoutInfo *)0x0) || (this_00->tabbed != false)) {
              QVar15 = itemRect(this,index,false);
              goto LAB_003ef771;
            }
            gapIndex((QList<int> *)local_58,this_00,_pos,nestingEnabled,tabMode);
            QArrayDataPointer<int>::operator=
                      (&__return_storage_ptr__->d,(QArrayDataPointer<int> *)local_58);
            piVar3 = (int *)CONCAT44(local_58._4_4_,local_58._0_4_);
            if (piVar3 != (int *)0x0) {
              LOCK();
              *piVar3 = *piVar3 + -1;
              UNLOCK();
              if (*piVar3 == 0) {
                QArrayData::deallocate((QArrayData *)CONCAT44(local_58._4_4_,local_58._0_4_),4,0x10)
                ;
              }
            }
            local_58._0_4_ = index;
            QtPrivate::QPodArrayOps<int>::emplace<int&>
                      ((QPodArrayOps<int> *)__return_storage_ptr__,0,(int *)local_58);
            goto LAB_003ef892;
          }
          uVar8 = uVar14 & 0xffffffff;
        }
        index = (uint)uVar8;
        uVar14 = uVar14 + 1;
        lVar12 = lVar12 + 0x28;
      } while (uVar14 < (ulong)(this->item_list).d.size);
      uVar14 = 0;
      QVar15 = (QRect)(ZEXT816(0xffffffffffffffff) << 0x40);
LAB_003ef771:
      uVar13 = (uint)uVar14;
    }
    if ((QVar15.x1.m_i.m_i + -1 != QVar15.x2.m_i.m_i) ||
       (QVar15.y1.m_i.m_i + -1 != QVar15.y2.m_i.m_i)) goto LAB_003ef4d2;
    local_58._0_4_ = index + 1;
LAB_003ef87e:
    i = (__return_storage_ptr__->d).size;
    goto LAB_003ef882;
  }
  QVar15 = tabContentRect(this);
  uVar13 = 0;
LAB_003ef4d2:
  if (tabMode == ForceTabs) {
LAB_003ef4dc:
    uVar13 = ~uVar13;
LAB_003ef4df:
    local_58._0_4_ = uVar13;
    QtPrivate::QPodArrayOps<int>::emplace<int&>
              ((QPodArrayOps<int> *)__return_storage_ptr__,(__return_storage_ptr__->d).size,
               (int *)local_58);
    QList<int>::end(__return_storage_ptr__);
    local_58._0_4_ = 0;
  }
  else {
    OVar1 = this->o;
    iVar9 = (_pos->xp).m_i - QVar15.x1.m_i;
    iVar7 = (_pos->yp).m_i - QVar15.y1.m_i;
    local_40 = CONCAT44(iVar7,iVar9);
    iVar11 = (QVar15.x2.m_i.m_i - QVar15.x1.m_i) + 1;
    iVar10 = (QVar15.y2.m_i.m_i - QVar15.y1.m_i) + 1;
    if (tabMode != NoTabs) {
      if (nestingEnabled) {
        local_58._0_4_ = iVar11 / 6;
        local_58._4_4_ = iVar10 / 6;
        local_50 = local_58._0_4_ + (iVar11 * 2) / 3 + -1;
        local_4c = local_58._4_4_ + (iVar10 * 2) / 3 + -1;
        cVar5 = QRect::contains((QPoint *)local_58,SUB81(&local_40,0));
        if (cVar5 == '\0') goto LAB_003ef6a6;
      }
      else if (OVar1 == Horizontal) {
        if ((iVar9 <= iVar11 / 6) || ((iVar11 * 5) / 6 <= iVar9)) goto LAB_003ef7f3;
      }
      else if ((iVar7 <= iVar10 / 6) || ((iVar10 * 5) / 6 <= iVar7)) goto LAB_003ef85c;
      goto LAB_003ef4dc;
    }
    if (nestingEnabled) {
LAB_003ef6a6:
      if (OVar1 == Horizontal) {
        if (iVar9 < iVar11 / 3) goto LAB_003ef802;
        if (iVar9 <= (iVar11 * 2) / 3) goto LAB_003ef85c;
LAB_003ef80f:
        if (this->o == Horizontal) {
LAB_003ef81a:
          local_58._0_4_ = uVar13 + 1;
          goto LAB_003ef87e;
        }
        goto LAB_003ef8c3;
      }
      if (iVar7 < iVar10 / 3) goto LAB_003ef86b;
      if ((iVar10 * 2) / 3 < iVar7) goto LAB_003ef8b8;
LAB_003ef7f3:
      if (iVar11 / 2 <= iVar9) goto LAB_003ef80f;
LAB_003ef802:
      local_58._0_4_ = uVar13;
      if (this->o == Horizontal) goto LAB_003ef87e;
      goto LAB_003ef4df;
    }
    if (OVar1 == Horizontal) goto LAB_003ef7f3;
LAB_003ef85c:
    if (iVar7 < iVar10 / 2) {
LAB_003ef86b:
      local_58._0_4_ = uVar13;
      if (this->o != Horizontal) goto LAB_003ef87e;
      goto LAB_003ef4df;
    }
LAB_003ef8b8:
    if (this->o != Horizontal) goto LAB_003ef81a;
LAB_003ef8c3:
    local_58._0_4_ = uVar13;
    QtPrivate::QPodArrayOps<int>::emplace<int&>
              ((QPodArrayOps<int> *)__return_storage_ptr__,(__return_storage_ptr__->d).size,
               (int *)local_58);
    QList<int>::end(__return_storage_ptr__);
    local_58._0_4_ = 1;
  }
  i = (__return_storage_ptr__->d).size;
LAB_003ef882:
  QtPrivate::QPodArrayOps<int>::emplace<int&>
            ((QPodArrayOps<int> *)__return_storage_ptr__,i,(int *)local_58);
  QList<int>::end(__return_storage_ptr__);
LAB_003ef892:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QList<int> QDockAreaLayoutInfo::gapIndex(const QPoint& _pos,
                        bool nestingEnabled, TabMode tabMode) const
{
    QList<int> result;
    QRect item_rect;
    int item_index = 0;

#if QT_CONFIG(tabbar)
    if (tabbed) {
        item_rect = tabContentRect();
    } else
#endif
    {
        int pos = pick(o, _pos);

        int last = -1;
        for (int i = 0; i < item_list.size(); ++i) {
            const QDockAreaLayoutItem &item = item_list.at(i);
            if (item.skip())
                continue;

            last = i;

            if (item.pos + item.size < pos)
                continue;

            if (item.subinfo != nullptr
#if QT_CONFIG(tabbar)
                && !item.subinfo->tabbed
#endif
                ) {
                result = item.subinfo->gapIndex(_pos, nestingEnabled,
                                                    tabMode);
                result.prepend(i);
                return result;
            }

            item_rect = itemRect(i);
            item_index = i;
            break;
        }

        if (item_rect.isNull()) {
            result.append(last + 1);
            return result;
        }
    }

    Q_ASSERT(!item_rect.isNull());

    QInternal::DockPosition dock_pos
        = dockPosHelper(item_rect, _pos, o, nestingEnabled, tabMode);

    switch (dock_pos) {
        case QInternal::LeftDock:
            if (o == Qt::Horizontal)
                result << item_index;
            else
                result << item_index << 0; // this subinfo doesn't exist yet, but insertGap()
                                           // handles this by inserting it
            break;
        case QInternal::RightDock:
            if (o == Qt::Horizontal)
                result << item_index + 1;
            else
                result << item_index << 1;
            break;
        case QInternal::TopDock:
            if (o == Qt::Horizontal)
                result << item_index << 0;
            else
                result << item_index;
            break;
        case QInternal::BottomDock:
            if (o == Qt::Horizontal)
                result << item_index << 1;
            else
                result << item_index + 1;
            break;
        case  QInternal::DockCount:
            result << (-item_index - 1) << 0;   // negative item_index means "on top of"
                                                // -item_index - 1, insertGap()
                                                // will insert a tabbed subinfo
            break;
        default:
            break;
    }

    return result;
}